

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExternInterfaceMethodSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternInterfaceMethodSyntax,slang::syntax::ExternInterfaceMethodSyntax_const&>
          (BumpAllocator *this,ExternInterfaceMethodSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  FunctionPrototypeSyntax *pFVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  ExternInterfaceMethodSyntax *pEVar18;
  
  pEVar18 = (ExternInterfaceMethodSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExternInterfaceMethodSyntax *)this->endPtr < pEVar18 + 1) {
    pEVar18 = (ExternInterfaceMethodSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pEVar18 + 1);
  }
  (pEVar18->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pEVar18->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar18->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pEVar18->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pEVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pEVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar18->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pEVar18->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar18->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar18->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar18->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062f0b8;
  uVar7 = (args->externKeyword).field_0x2;
  NVar8.raw = (args->externKeyword).numFlags.raw;
  uVar9 = (args->externKeyword).rawLen;
  pIVar3 = (args->externKeyword).info;
  TVar10 = (args->forkJoin).kind;
  uVar11 = (args->forkJoin).field_0x2;
  NVar12.raw = (args->forkJoin).numFlags.raw;
  uVar13 = (args->forkJoin).rawLen;
  pIVar4 = (args->forkJoin).info;
  pFVar5 = (args->prototype).ptr;
  TVar14 = (args->semi).kind;
  uVar15 = (args->semi).field_0x2;
  NVar16.raw = (args->semi).numFlags.raw;
  uVar17 = (args->semi).rawLen;
  (pEVar18->externKeyword).kind = (args->externKeyword).kind;
  (pEVar18->externKeyword).field_0x2 = uVar7;
  (pEVar18->externKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar18->externKeyword).rawLen = uVar9;
  (pEVar18->externKeyword).info = pIVar3;
  (pEVar18->forkJoin).kind = TVar10;
  (pEVar18->forkJoin).field_0x2 = uVar11;
  (pEVar18->forkJoin).numFlags = (NumericTokenFlags)NVar12.raw;
  (pEVar18->forkJoin).rawLen = uVar13;
  (pEVar18->forkJoin).info = pIVar4;
  (pEVar18->prototype).ptr = pFVar5;
  (pEVar18->semi).kind = TVar14;
  (pEVar18->semi).field_0x2 = uVar15;
  (pEVar18->semi).numFlags = (NumericTokenFlags)NVar16.raw;
  (pEVar18->semi).rawLen = uVar17;
  (pEVar18->semi).info = (args->semi).info;
  return pEVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }